

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O3

void __thiscall
test_matrix_sparse_operator_matrix_subraction_assignement_Test::TestBody
          (test_matrix_sparse_operator_matrix_subraction_assignement_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<double> value_01;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  Scalar *pSVar5;
  char *pcVar6;
  long lVar7;
  StringLike<const_char_*> *regex;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> non_zero_01;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> index_01;
  Matrix_Sparse matrix_wrong_size;
  DeathTest *gtest_dt;
  Matrix_Sparse matrix;
  Matrix_Sparse identity;
  AssertHelper local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined1 local_1a8 [32];
  undefined1 local_188 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_180;
  pointer local_178;
  pointer pdStack_170;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  Matrix_Sparse local_118;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **local_c0;
  undefined8 uStack_b8;
  AssertHelper *local_b0;
  undefined8 uStack_a8;
  iterator local_a0;
  undefined8 uStack_98;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_90;
  Matrix_Sparse local_78;
  
  local_118.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  local_118.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_118.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  local_188 = (undefined1  [8])0x0;
  pbStack_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_178 = (pointer)0x2;
  local_a0 = (iterator)local_1a8;
  local_1a8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x3ff0000000000000;
  local_1a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
  local_1a8._16_8_ = (pointer)0x3ff0000000000000;
  uStack_98 = 3;
  value._M_len = 3;
  value._M_array = local_a0;
  non_zero._M_len = 4;
  non_zero._M_array = (iterator)&local_118;
  index._M_len = 3;
  index._M_array = (iterator)local_188;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_78,non_zero,index,value,3);
  local_178 = (pointer)0x2;
  pdStack_170 = (pointer)0x3;
  local_188 = (undefined1  [8])0x0;
  pbStack_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_1a8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x2;
  local_1a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_1a8._16_8_ = (pointer)0x0;
  local_b0 = &local_1c8;
  local_1c8.data_ = (AssertHelperData *)&DAT_4008000000000000;
  uStack_1c0 = 0xc010000000000000;
  local_1b8 = 0x4014000000000000;
  uStack_a8 = 3;
  value_00._M_len = 3;
  value_00._M_array = (iterator)local_b0;
  non_zero_00._M_len = 4;
  non_zero_00._M_array = (iterator)local_188;
  index_00._M_len = 3;
  index_00._M_array = (iterator)local_1a8;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_118,non_zero_00,index_00,value_00,3);
  Disa::Matrix_Sparse::matrix_arithmetic<false>(&local_118,&local_78);
  local_1a8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )0x0;
  if (local_78.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_78.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_1a8._0_8_ =
         ((long)local_78.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1;
  }
  local_1c8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"identity.size_row()","3",(unsigned_long *)local_1a8,
             (int *)&local_1c8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x23e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8._0_8_ = local_78.column_size;
  local_1c8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"identity.size_column()","3",(unsigned_long *)local_1a8,
             (int *)&local_1c8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x23f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8._0_8_ =
       (long)local_78.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_78.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_1c8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"identity.size_non_zero()","3",(unsigned_long *)local_1a8,
             (int *)&local_1c8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x240,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        )0x0;
  if (local_118.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_118.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_1a8._0_8_ =
         ((long)local_118.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_118.row_non_zero.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) + -1;
  }
  local_1c8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"matrix.size_row()","3",(unsigned_long *)local_1a8,
             (int *)&local_1c8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x242,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8._0_8_ = local_118.column_size;
  local_1c8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"matrix.size_column()","3",(unsigned_long *)local_1a8,
             (int *)&local_1c8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x243,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8._0_8_ =
       (long)local_118.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_118.column_index.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_1c8.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_188,"matrix.size_non_zero()","5",(unsigned_long *)local_1a8,
             (int *)&local_1c8);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x244,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8.data_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1a8,(size_t *)&local_118);
  local_138 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1a8,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"matrix[0][0]","-1.0",*pSVar5,-1.0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x245,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1a8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8.data_ = (AssertHelperData *)0x0;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1a8,(size_t *)&local_118);
  local_138 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1a8,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"matrix[0][2]","3.0",*pSVar5,3.0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x246,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8.data_ = (AssertHelperData *)0x1;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1a8,(size_t *)&local_118);
  local_138 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1a8,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"matrix[1][1]","-5.0",*pSVar5,-5.0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x247,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8.data_ = (AssertHelperData *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1a8,(size_t *)&local_118);
  local_138 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1a8,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"matrix[2][0]","5.0",*pSVar5,5.0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x248,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1c8.data_ = (AssertHelperData *)0x2;
  Disa::Matrix_Sparse::operator[]((Matrix_Sparse *)local_1a8,(size_t *)&local_118);
  local_138 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  pSVar5 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_1a8,(size_t *)&local_138);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"matrix[2][2]","-1.0",*pSVar5,-1.0);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1a8);
    if (pbStack_180 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (pbStack_180->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x249,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1a8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_1a8._0_8_ + 8))();
    }
  }
  if (pbStack_180 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_180,pbStack_180);
  }
  local_1a8._16_8_ = (pointer)0x2;
  local_1a8._24_8_ = (pointer)0x3;
  local_1a8._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  local_1a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_1c8.data_ = (AssertHelperData *)0x2;
  uStack_1c0 = 1;
  local_1b8 = 0;
  local_138 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &DAT_4008000000000000;
  uStack_130 = 0xc010000000000000;
  local_128 = 0x4014000000000000;
  uStack_b8 = 3;
  value_01._M_len = 3;
  value_01._M_array = (iterator)&local_138;
  non_zero_01._M_len = 4;
  non_zero_01._M_array = (iterator)local_1a8;
  index_01._M_len = 3;
  index_01._M_array = (iterator)&local_1c8;
  local_c0 = &local_138;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_188,non_zero_01,index_01,value_01,4);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_1c8.data_ = (AssertHelperData *)0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1a8,
               (testing *)&local_1c8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_90,(PolymorphicMatcher *)local_1a8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("matrix -= matrix_wrong_size",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_90,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x24c,(DeathTest **)&local_138);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_90);
    pbVar8 = local_138;
    if (!bVar2) goto LAB_00123ca6;
    if (local_138 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00123cfc;
    iVar4 = (**(code **)(*(long *)local_138 + 0x10))(local_138);
    pbVar1 = local_138;
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*(long *)local_138 + 0x18))(local_138);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*(long *)pbVar1 + 0x20))(pbVar1,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(*(long *)pbVar8 + 8))(pbVar8);
        goto LAB_00123ca6;
      }
    }
    else if (iVar4 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        Disa::Matrix_Sparse::matrix_arithmetic<false>(&local_118,(Matrix_Sparse *)local_188);
      }
      (**(code **)(*(long *)local_138 + 0x28))(local_138,2);
      (**(code **)(*(long *)pbVar1 + 0x28))(pbVar1,0);
    }
    lVar7 = *(long *)pbVar8;
  }
  else {
LAB_00123ca6:
    testing::Message::Message((Message *)local_1a8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x24c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._0_8_
        == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00123cfc;
    lVar7 = *(long *)local_1a8._0_8_;
    pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_1a8._0_8_;
  }
  (**(code **)(lVar7 + 8))(pbVar8);
LAB_00123cfc:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_188);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_118);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_78);
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_matrix_subraction_assignement) {
  Matrix_Sparse identity({0, 1, 2, 3}, {0, 1, 2}, {1.0, 1.0, 1.0}, 3);
  Matrix_Sparse matrix({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 3);
  matrix -= identity;

  EXPECT_EQ(identity.size_row(), 3);
  EXPECT_EQ(identity.size_column(), 3);
  EXPECT_EQ(identity.size_non_zero(), 3);

  EXPECT_EQ(matrix.size_row(), 3);
  EXPECT_EQ(matrix.size_column(), 3);
  EXPECT_EQ(matrix.size_non_zero(), 5);
  EXPECT_DOUBLE_EQ(matrix[0][0], -1.0);
  EXPECT_DOUBLE_EQ(matrix[0][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix[1][1], -5.0);
  EXPECT_DOUBLE_EQ(matrix[2][0], 5.0);
  EXPECT_DOUBLE_EQ(matrix[2][2], -1.0);

  Matrix_Sparse matrix_wrong_size({0, 1, 2, 3}, {2, 1, 0}, {3.0, -4.0, 5.0}, 4);
  EXPECT_DEATH(matrix -= matrix_wrong_size, "./*");
}